

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O0

void __thiscall
QGraphicsViewPrivate::mouseMoveEventHandler(QGraphicsViewPrivate *this,QMouseEvent *event)

{
  bool bVar1;
  QFlagsStorage<Qt::MouseButton> QVar2;
  QFlagsStorage<Qt::KeyboardModifier> QVar3;
  Int IVar4;
  QWidget *this_00;
  QMouseEvent *pQVar5;
  QObject *pQVar6;
  QGraphicsScenePrivate *pQVar7;
  QPoint *in_RSI;
  QGraphicsViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  add_const_t<QList<QGraphicsItem_*>_> *__range1;
  QGraphicsView *q;
  const_iterator __end1;
  const_iterator __begin1;
  QGraphicsSceneMouseEvent mouseEvent;
  undefined4 in_stack_fffffffffffffec8;
  MouseEventSource in_stack_fffffffffffffecc;
  QGraphicsViewPrivate *in_stack_fffffffffffffed0;
  QPointF *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined1 uVar8;
  undefined8 in_stack_fffffffffffffee8;
  MouseButton button;
  QGraphicsView *in_stack_fffffffffffffef8;
  QWidget *scenePos;
  QGraphicsViewPrivate *this_01;
  QCursor local_d0;
  QGraphicsItem **local_c8;
  const_iterator local_c0;
  const_iterator local_b8;
  QPointF local_b0;
  QPoint local_a0;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_7c;
  QPoint local_78;
  QPointF local_70;
  QPointF local_60;
  QPoint local_50;
  QPointF local_48;
  QPoint local_38;
  QPointF local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  button = (MouseButton)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = (QWidget *)q_func(in_RDI);
  updateRubberBand(this_01,(QMouseEvent *)in_RSI);
  storeMouseEvent(in_stack_fffffffffffffed0,
                  (QMouseEvent *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  pQVar5 = QEventStorage<QMouseEvent>::operator->(&in_RDI->lastMouseEvent);
  (**(code **)(*(long *)pQVar5 + 0x10))(pQVar5,0);
  if ((((*(uint *)&in_RDI->field_0x300 & 1) != 0) && ((*(uint *)&in_RDI->field_0x300 >> 9 & 1) == 0)
      ) && (bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QGraphicsScene> *)0xa330a8), bVar1))
  {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneMouseEvent::QGraphicsSceneMouseEvent
              ((QGraphicsSceneMouseEvent *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
               (Type)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    QGraphicsSceneEvent::setWidget
              ((QGraphicsSceneEvent *)in_stack_fffffffffffffed0,
               (QWidget *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QGraphicsSceneMouseEvent::setButtonDownScenePos
              ((QGraphicsSceneMouseEvent *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),button,
               in_stack_fffffffffffffed8);
    QGraphicsSceneMouseEvent::setButtonDownScreenPos
              ((QGraphicsSceneMouseEvent *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),button,
               (QPoint *)in_stack_fffffffffffffed8);
    scenePos = this_00;
    local_48 = QSinglePointEvent::position((QSinglePointEvent *)0xa3315b);
    local_38 = QPointF::toPoint((QPointF *)
                                CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    local_30 = QGraphicsView::mapToScene(in_stack_fffffffffffffef8,(QPoint *)in_RDI);
    QGraphicsSceneMouseEvent::setScenePos
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,
               (QPointF *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_60 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0xa331c5);
    local_50 = QPointF::toPoint((QPointF *)
                                CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    QGraphicsSceneMouseEvent::setScreenPos
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,
               (QPoint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QGraphicsSceneMouseEvent::setLastScenePos
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,
               (QPointF *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QGraphicsSceneMouseEvent::setLastScreenPos
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,
               (QPoint *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    QVar2.i = (Int)QSinglePointEvent::buttons((QSinglePointEvent *)in_stack_fffffffffffffed0);
    QGraphicsSceneMouseEvent::setButtons
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,
               (QFlagsStorageHelper<Qt::MouseButton,_4>)
               SUB84((ulong)in_stack_fffffffffffffed8 >> 0x20,0));
    QSinglePointEvent::button((QSinglePointEvent *)in_RSI);
    QGraphicsSceneMouseEvent::setButton
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    QVar3.i = (Int)QInputEvent::modifiers((QInputEvent *)in_stack_fffffffffffffed0);
    QGraphicsSceneMouseEvent::setModifiers
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,
               (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
               SUB84((ulong)in_stack_fffffffffffffed8 >> 0x20,0));
    QMouseEvent::source();
    QGraphicsSceneMouseEvent::setSource
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    QMouseEvent::flags();
    QGraphicsSceneMouseEvent::setFlags
              ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0,
               (QFlagsStorageHelper<Qt::MouseEventFlag,_4>)
               SUB84((ulong)in_stack_fffffffffffffed8 >> 0x20,0));
    QInputEvent::timestamp((QInputEvent *)in_RSI);
    QGraphicsSceneEvent::setTimestamp
              ((QGraphicsSceneEvent *)in_stack_fffffffffffffed0,
               CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    local_70 = QGraphicsSceneMouseEvent::scenePos
                         ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed8);
    (in_RDI->lastMouseMoveScenePoint).xp = local_70.xp;
    (in_RDI->lastMouseMoveScenePoint).yp = local_70.yp;
    local_78 = QGraphicsSceneMouseEvent::screenPos
                         ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0);
    in_RDI->lastMouseMoveScreenPoint = local_78;
    QEvent::setAccepted((QEvent *)&local_20,false);
    bVar1 = QEvent::spontaneous((QEvent *)in_RSI);
    if (bVar1) {
      ::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3337a);
      qt_sendSpontaneousEvent
                ((QObject *)in_stack_fffffffffffffed0,
                 (QEvent *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    }
    else {
      pQVar6 = &::QPointer::operator_cast_to_QGraphicsScene_((QPointer<QGraphicsScene> *)0xa3339d)->
                super_QObject;
      QCoreApplication::sendEvent(pQVar6,(QEvent *)&local_20);
    }
    pQVar5 = QEventStorage<QMouseEvent>::operator->(&in_RDI->lastMouseEvent);
    bVar1 = QEvent::isAccepted((QEvent *)&local_20);
    (**(code **)(*(long *)pQVar5 + 0x10))(pQVar5,bVar1);
    bVar1 = QEvent::isAccepted((QEvent *)&local_20);
    uVar8 = false;
    if (bVar1) {
      local_7c.super_QFlagsStorage<Qt::MouseButton>.i =
           (QFlagsStorage<Qt::MouseButton>)
           QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0);
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
      uVar8 = IVar4 != 0;
    }
    if ((bool)uVar8 == false) {
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa33455);
      pQVar7 = QGraphicsScene::d_func((QGraphicsScene *)0xa3345d);
      if ((*(uint *)&pQVar7->field_0xb8 >> 0xc & 1) != 0) {
        QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa33483);
        pQVar7 = QGraphicsScene::d_func((QGraphicsScene *)0xa3348b);
        if ((*(uint *)&pQVar7->field_0xb8 >> 0xd & 1) == 0) {
          QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa334b1);
          QGraphicsScene::d_func((QGraphicsScene *)0xa334b9);
          bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0xa334c8);
          if (bVar1) {
            QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa334e2);
            in_stack_fffffffffffffed0 =
                 (QGraphicsViewPrivate *)QGraphicsScene::d_func((QGraphicsScene *)0xa334ea);
            local_a0 = QGraphicsSceneMouseEvent::screenPos
                                 ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffed0);
            local_b0 = QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)pQVar5);
            QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0xa33530);
            QGraphicsScenePrivate::itemsAtPosition
                      ((QGraphicsScenePrivate *)this_01,in_RSI,(QPointF *)scenePos,
                       (QWidget *)CONCAT44(QVar2.i,QVar3.i));
            QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa33566);
            QGraphicsScene::d_func((QGraphicsScene *)0xa3356e);
            QList<QGraphicsItem_*>::operator=
                      ((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0,
                       (QList<QGraphicsItem_*> *)
                       CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            QList<QGraphicsItem_*>::~QList((QList<QGraphicsItem_*> *)0xa33592);
          }
        }
      }
      QPointer<QGraphicsScene>::operator->((QPointer<QGraphicsScene> *)0xa335b2);
      QGraphicsScene::d_func((QGraphicsScene *)0xa335ba);
      local_b8.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_b8 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0);
      local_c0.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
      local_c0 = QList<QGraphicsItem_*>::end((QList<QGraphicsItem_*> *)in_stack_fffffffffffffed0);
      while( true ) {
        local_c8 = local_c0.i;
        bVar1 = QList<QGraphicsItem_*>::const_iterator::operator!=(&local_b8,local_c0);
        if (!bVar1) break;
        QList<QGraphicsItem_*>::const_iterator::operator*(&local_b8);
        bVar1 = QGraphicsItem::isEnabled((QGraphicsItem *)0xa33642);
        if ((bVar1) && (bVar1 = QGraphicsItem::hasCursor((QGraphicsItem *)0xa33652), bVar1)) {
          QGraphicsItem::cursor((QGraphicsItem *)CONCAT17(uVar8,in_stack_fffffffffffffee0));
          _q_setViewportCursor
                    (in_stack_fffffffffffffed0,
                     (QCursor *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
          QCursor::~QCursor(&local_d0);
          goto LAB_00a336d3;
        }
        QList<QGraphicsItem_*>::const_iterator::operator++(&local_b8);
      }
      if ((in_RDI->hasStoredOriginalCursor & 1U) != 0) {
        in_RDI->hasStoredOriginalCursor = false;
        QWidget::setCursor(this_00,(QCursor *)CONCAT17(uVar8,in_stack_fffffffffffffee0));
      }
    }
LAB_00a336d3:
    QGraphicsSceneMouseEvent::~QGraphicsSceneMouseEvent((QGraphicsSceneMouseEvent *)0xa336e0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsViewPrivate::mouseMoveEventHandler(QMouseEvent *event)
{
    Q_Q(QGraphicsView);

#if QT_CONFIG(rubberband)
    updateRubberBand(event);
#endif

    storeMouseEvent(event);
    lastMouseEvent->setAccepted(false);

    if (!sceneInteractionAllowed)
        return;
    if (handScrolling)
        return;
    if (!scene)
        return;

    QGraphicsSceneMouseEvent mouseEvent(QEvent::GraphicsSceneMouseMove);
    mouseEvent.setWidget(viewport);
    mouseEvent.setButtonDownScenePos(mousePressButton, mousePressScenePoint);
    mouseEvent.setButtonDownScreenPos(mousePressButton, mousePressScreenPoint);
    mouseEvent.setScenePos(q->mapToScene(event->position().toPoint()));
    mouseEvent.setScreenPos(event->globalPosition().toPoint());
    mouseEvent.setLastScenePos(lastMouseMoveScenePoint);
    mouseEvent.setLastScreenPos(lastMouseMoveScreenPoint);
    mouseEvent.setButtons(event->buttons());
    mouseEvent.setButton(event->button());
    mouseEvent.setModifiers(event->modifiers());
    mouseEvent.setSource(event->source());
    mouseEvent.setFlags(event->flags());
    mouseEvent.setTimestamp(event->timestamp());
    lastMouseMoveScenePoint = mouseEvent.scenePos();
    lastMouseMoveScreenPoint = mouseEvent.screenPos();
    mouseEvent.setAccepted(false);
    if (event->spontaneous())
        qt_sendSpontaneousEvent(scene, &mouseEvent);
    else
        QCoreApplication::sendEvent(scene, &mouseEvent);

    // Remember whether the last event was accepted or not.
    lastMouseEvent->setAccepted(mouseEvent.isAccepted());

    if (mouseEvent.isAccepted() && mouseEvent.buttons() != 0) {
        // The event was delivered to a mouse grabber; the press is likely to
        // have set a cursor, and we must not change it.
        return;
    }

#ifndef QT_NO_CURSOR
    // If all the items ignore hover events, we don't look-up any items
    // in QGraphicsScenePrivate::dispatchHoverEvent, hence the
    // cachedItemsUnderMouse list will be empty. We therefore do the look-up
    // for cursor items here if not all items use the default cursor.
    if (scene->d_func()->allItemsIgnoreHoverEvents && !scene->d_func()->allItemsUseDefaultCursor
        && scene->d_func()->cachedItemsUnderMouse.isEmpty()) {
        scene->d_func()->cachedItemsUnderMouse = scene->d_func()->itemsAtPosition(mouseEvent.screenPos(),
                                                                                  mouseEvent.scenePos(),
                                                                                  mouseEvent.widget());
    }
    // Find the topmost item under the mouse with a cursor.
    for (QGraphicsItem *item : std::as_const(scene->d_func()->cachedItemsUnderMouse)) {
        if (item->isEnabled() && item->hasCursor()) {
            _q_setViewportCursor(item->cursor());
            return;
        }
    }

    // No items with cursors found; revert to the view cursor.
    if (hasStoredOriginalCursor) {
        // Restore the original viewport cursor.
        hasStoredOriginalCursor = false;
        viewport->setCursor(originalCursor);
    }
#endif
}